

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

CMutableTransaction * __thiscall
TestChain100Setup::CreateValidMempoolTransaction
          (TestChain100Setup *this,CTransactionRef *input_transaction,uint32_t input_vout,
          int input_height,CKey *input_signing_key,CScript *output_destination,CAmount output_amount
          ,bool submit)

{
  CMutableTransaction *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  CTxOut output;
  COutPoint input;
  CTransaction *in_stack_fffffffffffffcc8;
  CTxOut *this_00;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  COutPoint *in_stack_fffffffffffffcd8;
  CKey *in_stack_fffffffffffffcf0;
  CKey *in_stack_fffffffffffffcf8;
  allocator_type *in_stack_fffffffffffffd00;
  CTxOut *in_stack_fffffffffffffd08;
  initializer_list<CTxOut> in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd47;
  vector<CKey,_std::allocator<CKey>_> *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  int input_height_00;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_fffffffffffffd58;
  undefined1 *puVar2;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffffd60;
  TestChain100Setup *in_stack_fffffffffffffd68;
  undefined8 *local_288;
  undefined8 *local_270;
  CTxOut local_168;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_fffffffffffffee0;
  undefined8 local_f0 [5];
  undefined8 local_c8 [2];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [76];
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined8 local_1c;
  undefined8 uStack_14;
  undefined4 local_c;
  long local_8;
  
  input_height_00 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffcc8);
  CTransaction::GetHash(in_stack_fffffffffffffcc8);
  COutPoint::COutPoint
            (in_stack_fffffffffffffcd8,
             (Txid *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             (uint32_t)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  CScript::CScript((CScript *)in_stack_fffffffffffffcc8,(CScript *)0xeaa772);
  CTxOut::CTxOut(in_stack_fffffffffffffd08,(CAmount *)in_stack_fffffffffffffd00,
                 (CScript *)in_stack_fffffffffffffcf8);
  CScript::~CScript((CScript *)in_stack_fffffffffffffcc8);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcc8,
             (shared_ptr<const_CTransaction> *)0xeaa7bb);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_fffffffffffffcc8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffffd08,
           (initializer_list<std::shared_ptr<const_CTransaction>_>)in_stack_fffffffffffffd10,
           (allocator_type *)in_stack_fffffffffffffd00);
  local_98 = local_c;
  local_a8 = local_1c;
  uStack_a0 = uStack_14;
  local_b8 = local_2c;
  uStack_b0 = uStack_24;
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_fffffffffffffcc8);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffd08,
             (initializer_list<COutPoint>)in_stack_fffffffffffffd10,
             (allocator_type *)in_stack_fffffffffffffd00);
  CKey::CKey(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::allocator<CKey>::allocator((allocator<CKey> *)in_stack_fffffffffffffcc8);
  std::vector<CKey,_std::allocator<CKey>_>::vector
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_fffffffffffffd08,
             (initializer_list<CKey>)in_stack_fffffffffffffd10,
             (allocator_type *)in_stack_fffffffffffffd00);
  CTxOut::CTxOut((CTxOut *)in_stack_fffffffffffffcc8,(CTxOut *)0xeaa93b);
  std::allocator<CTxOut>::allocator((allocator<CTxOut> *)in_stack_fffffffffffffcc8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd08,
             in_stack_fffffffffffffd10,in_stack_fffffffffffffd00);
  this_00 = &local_168;
  CreateValidMempoolTransaction
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             input_height_00,in_stack_fffffffffffffd48,in_stack_fffffffffffffee0,
             (bool)in_stack_fffffffffffffd47);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffcd8);
  std::allocator<CTxOut>::~allocator((allocator<CTxOut> *)this_00);
  local_270 = local_c8;
  do {
    local_270 = local_270 + -5;
    CTxOut::~CTxOut(this_00);
  } while (local_270 != local_f0);
  std::vector<CKey,_std::allocator<CKey>_>::~vector
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_fffffffffffffcd8);
  std::allocator<CKey>::~allocator((allocator<CKey> *)this_00);
  local_288 = &local_b8;
  do {
    local_288 = local_288 + -2;
    CKey::~CKey((CKey *)this_00);
  } while (local_288 != local_c8);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffcd8);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)this_00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffffcd8);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)this_00);
  puVar2 = local_88;
  puVar1 = local_78;
  do {
    puVar1 = puVar1 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  } while (puVar1 != puVar2);
  CTxOut::~CTxOut(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(CTransactionRef input_transaction,
                                                                     uint32_t input_vout,
                                                                     int input_height,
                                                                     CKey input_signing_key,
                                                                     CScript output_destination,
                                                                     CAmount output_amount,
                                                                     bool submit)
{
    COutPoint input{input_transaction->GetHash(), input_vout};
    CTxOut output{output_amount, output_destination};
    return CreateValidMempoolTransaction(/*input_transactions=*/{input_transaction},
                                         /*inputs=*/{input},
                                         /*input_height=*/input_height,
                                         /*input_signing_keys=*/{input_signing_key},
                                         /*outputs=*/{output},
                                         /*submit=*/submit);
}